

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall ACSStringPool::LockStringArray(ACSStringPool *this,int *strnum,uint count)

{
  uint *puVar1;
  uint uVar2;
  PoolEntry *pPVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar2 = (this->Pool).Count;
  pPVar3 = (this->Pool).Array;
  for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
    if (((strnum[uVar4] & 0xfff00000U) == 0x7ff00000) &&
       (uVar5 = strnum[uVar4] & 0xfffff, uVar5 < uVar2)) {
      puVar1 = &pPVar3[uVar5].LockCount;
      *puVar1 = *puVar1 + 1;
    }
  }
  return;
}

Assistant:

void ACSStringPool::LockStringArray(const int *strnum, unsigned int count)
{
	for (unsigned int i = 0; i < count; ++i)
	{
		int num = strnum[i];
		if ((num & LIBRARYID_MASK) == STRPOOL_LIBRARYID_OR)
		{
			num &= ~LIBRARYID_MASK;
			if ((unsigned)num < Pool.Size())
			{
				Pool[num].LockCount++;
			}
		}
	}
}